

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.h
# Opt level: O3

void __thiscall
BloomFilter<long_long>::BloomFilter(BloomFilter<long_long> *this,size_t m,size_t n,int seed,int k)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  _Bvector_impl *p_Var1;
  allocator_type local_62;
  bool local_61;
  vector<bool,_std::allocator<bool>_> *local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  this->_vptr_BloomFilter = (_func_int **)&PTR__BloomFilter_0010fd18;
  this_00 = &this->_bits;
  (this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_offset = 0;
  (this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->_hashes).
  super__Vector_base<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_hashes).
  super__Vector_base<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_hashes).
  super__Vector_base<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_max = n;
  this->_length = m;
  this->_seed = seed;
  local_61 = false;
  local_60 = this_00;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_58,m,&local_61,&local_62);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&this_00->super__Bvector_base<std::allocator<bool>_>);
  (this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  p_Var1 = &(this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl;
  (p_Var1->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  *(undefined4 *)&(p_Var1->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.field_0xc =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._12_4_;
  (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  *(ulong *)&(this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._12_4_,
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_offset);
  if (0 < k) {
    do {
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)MurmurHash64A;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = seed;
      std::
      vector<std::_Bind<unsigned_long(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(void_const*,int,unsigned_int)>,std::allocator<std::_Bind<unsigned_long(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(void_const*,int,unsigned_int)>>>
      ::
      emplace_back<std::_Bind<unsigned_long(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(void_const*,int,unsigned_int)>>
                ((vector<std::_Bind<unsigned_long(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(void_const*,int,unsigned_int)>,std::allocator<std::_Bind<unsigned_long(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(void_const*,int,unsigned_int)>>>
                  *)&this->_hashes,
                 (_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>
                  *)&local_58);
      seed = seed + 1;
      k = k + -1;
    } while (k != 0);
  }
  return;
}

Assistant:

BloomFilter<T>::BloomFilter(size_t m, size_t n, int seed, int k) :_length(m), _max(n), _seed(seed) {
    _bits = vector<bool>(m);
    for (int i = 0; i < k; i++) {
        _hashes.push_back(std::bind(MurmurHash64A, _1, _2, seed + i));
    }
}